

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::disposeImpl
          (HeapDisposer<capnp::_::(anonymous_namespace)::TestVat> *this,void *pointer)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  Context *pCVar7;
  char (*in_RCX) [23];
  long lVar8;
  Exception exception;
  String local_508;
  Exception local_4e8;
  Exception local_350;
  Exception local_1c0;
  
  if (pointer != (void *)0x0) {
    Debug::makeDescription<char_const(&)[23]>
              (&local_508,(Debug *)"\"Network was destroyed.\"","Network was destroyed.",in_RCX);
    Exception::Exception
              (&local_350,FAILED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x102,&local_508);
    sVar6 = local_508.content.size_;
    pcVar5 = local_508.content.ptr;
    if (local_508.content.ptr != (char *)0x0) {
      local_508.content.ptr = (char *)0x0;
      local_508.content.size_ = 0;
      (**(local_508.content.disposer)->_vptr_ArrayDisposer)
                (local_508.content.disposer,pcVar5,1,sVar6,sVar6,0);
    }
    lVar8 = *(long *)((long)pointer + 0x1c0);
    lVar1 = *(long *)((long)pointer + 0x1c8);
    if (lVar8 != lVar1) {
      do {
        lVar2 = *(long *)(lVar8 + 8);
        Exception::Exception(&local_4e8,&local_350);
        Exception::Exception(&local_1c0,&local_4e8);
        ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>::
        rejectAll((ProducerConsumerQueue<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_>
                   *)(lVar2 + 0x2a0),&local_1c0);
        Exception::~Exception(&local_1c0);
        if (*(char *)(lVar2 + 0x108) == '\x01') {
          *(undefined1 *)(lVar2 + 0x108) = 0;
          Exception::~Exception((Exception *)(lVar2 + 0x110));
        }
        pCVar7 = local_4e8.context.ptr.ptr;
        *(char **)(lVar2 + 0x110) = local_4e8.ownFile.content.ptr;
        *(size_t *)(lVar2 + 0x118) = local_4e8.ownFile.content.size_;
        *(ArrayDisposer **)(lVar2 + 0x120) = local_4e8.ownFile.content.disposer;
        local_4e8.ownFile.content.ptr = (char *)0x0;
        local_4e8.ownFile.content.size_ = 0;
        *(char **)(lVar2 + 0x128) = local_4e8.file;
        *(undefined8 *)(lVar2 + 0x130) = local_4e8._32_8_;
        *(char **)(lVar2 + 0x138) = local_4e8.description.content.ptr;
        *(size_t *)(lVar2 + 0x140) = local_4e8.description.content.size_;
        local_4e8.description.content.ptr = (char *)0x0;
        local_4e8.description.content.size_ = 0;
        *(ArrayDisposer **)(lVar2 + 0x148) = local_4e8.description.content.disposer;
        *(Disposer **)(lVar2 + 0x150) = local_4e8.context.ptr.disposer;
        local_4e8.context.ptr.ptr = (Context *)0x0;
        *(Context **)(lVar2 + 0x158) = pCVar7;
        *(char **)(lVar2 + 0x160) = local_4e8.remoteTrace.content.ptr;
        *(size_t *)(lVar2 + 0x168) = local_4e8.remoteTrace.content.size_;
        *(ArrayDisposer **)(lVar2 + 0x170) = local_4e8.remoteTrace.content.disposer;
        local_4e8.remoteTrace.content.ptr = (char *)0x0;
        local_4e8.remoteTrace.content.size_ = 0;
        memcpy((void *)(lVar2 + 0x178),local_4e8.trace,0x105);
        *(Detail **)(lVar2 + 0x280) = local_4e8.details.builder.ptr;
        *(RemoveConst<kj::Exception::Detail> **)(lVar2 + 0x288) = local_4e8.details.builder.pos;
        *(Detail **)(lVar2 + 0x290) = local_4e8.details.builder.endPtr;
        *(ArrayDisposer **)(lVar2 + 0x298) = local_4e8.details.builder.disposer;
        local_4e8.details.builder.endPtr = (Detail *)0x0;
        local_4e8.details.builder.ptr = (Detail *)0x0;
        local_4e8.details.builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
        *(undefined1 *)(lVar2 + 0x108) = 1;
        if (*(long *)(lVar2 + 0x2f0) != 0) {
          *(undefined8 *)(lVar2 + 0x2f0) = 0;
          (**(code **)**(undefined8 **)(lVar2 + 0x2e8))();
        }
        Exception::~Exception(&local_4e8);
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != lVar1);
    }
    Exception::~Exception(&local_350);
    lVar8 = *(long *)((long)pointer + 0x278);
    if (lVar8 != 0) {
      uVar3 = *(undefined8 *)((long)pointer + 0x280);
      *(undefined8 *)((long)pointer + 0x278) = 0;
      *(undefined8 *)((long)pointer + 0x280) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x288))
                (*(undefined8 **)((long)pointer + 0x288),lVar8,8,uVar3,uVar3,0);
    }
    lVar8 = *(long *)((long)pointer + 0x248);
    if (lVar8 != 0) {
      lVar1 = *(long *)((long)pointer + 0x250);
      lVar2 = *(long *)((long)pointer + 600);
      *(long *)((long)pointer + 0x248) = 0;
      *(undefined8 *)((long)pointer + 0x250) = 0;
      *(undefined8 *)((long)pointer + 600) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x260))
                (*(undefined8 **)((long)pointer + 0x260),lVar8,0x28,
                 (lVar1 - lVar8 >> 3) * -0x3333333333333333,
                 (lVar2 - lVar8 >> 3) * -0x3333333333333333,
                 ArrayDisposer::
                 Dispose_<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
                 ::destruct);
    }
    plVar4 = *(long **)((long)pointer + 0x240);
    if (plVar4 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x240) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x238))
                (*(undefined8 **)((long)pointer + 0x238),(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    WaiterQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
    ::~WaiterQueue((WaiterQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
                    *)((long)pointer + 0x220));
    std::__cxx11::
    _List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
    ::_M_clear((_List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
                *)((long)pointer + 0x208));
    lVar8 = *(long *)((long)pointer + 0x1f0);
    if (lVar8 != 0) {
      uVar3 = *(undefined8 *)((long)pointer + 0x1f8);
      *(undefined8 *)((long)pointer + 0x1f0) = 0;
      *(undefined8 *)((long)pointer + 0x1f8) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x200))
                (*(undefined8 **)((long)pointer + 0x200),lVar8,8,uVar3,uVar3,0);
    }
    lVar8 = *(long *)((long)pointer + 0x1c0);
    if (lVar8 != 0) {
      lVar1 = *(long *)((long)pointer + 0x1c8);
      lVar2 = *(long *)((long)pointer + 0x1d0);
      *(long *)((long)pointer + 0x1c0) = 0;
      *(undefined8 *)((long)pointer + 0x1c8) = 0;
      *(undefined8 *)((long)pointer + 0x1d0) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x1d8))
                (*(undefined8 **)((long)pointer + 0x1d8),lVar8,0x10,lVar1 - lVar8 >> 4,
                 lVar2 - lVar8 >> 4,0);
    }
    if (*(char *)((long)pointer + 0x28) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x30));
    }
  }
  operator_delete(pointer,0x290);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }